

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read(p_ply ply)

{
  p_ply_element ptVar1;
  int iVar2;
  p_ply_element in_RDI;
  p_ply_element element;
  p_ply_argument argument;
  long i;
  p_ply_argument argument_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  ptVar1 = in_RDI + 0x1d;
  argument_00 = (p_ply_argument)0x0;
  while( true ) {
    if (*(long *)(in_RDI->name + 0x10) <= (long)argument_00) {
      return 1;
    }
    *(long *)(ptVar1->name + 0xc0) = *(long *)(in_RDI->name + 8) + (long)argument_00 * 0x118;
    iVar2 = ply_read_element((p_ply)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,argument_00);
    if (iVar2 == 0) break;
    argument_00 = (p_ply_argument)((long)&argument_00->element + 1);
  }
  return 0;
}

Assistant:

int ply_read(p_ply ply) {
    long i;
    p_ply_argument argument;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    argument = &ply->argument;
    /* for each element type */
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        argument->element = element;
        if (!ply_read_element(ply, element, argument)) return 0;
    }
    return 1;
}